

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# voltage.h
# Opt level: O2

void saveVoltageTo(ostream *fs,int r,
                  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  *ivolt,vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                         *fvolt,
                  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                  *fall)

{
  long lVar1;
  uint uVar2;
  ostream *poVar3;
  long lVar4;
  ulong uVar5;
  ulong uVar6;
  ulong uVar7;
  ulong uVar8;
  
  *(uint *)(fs + *(long *)(*(long *)fs + -0x18) + 0x18) =
       *(uint *)(fs + *(long *)(*(long *)fs + -0x18) + 0x18) | 4;
  std::operator<<(fs,anon_var_dwarf_11c492);
  uVar2 = r - 1;
  lVar4 = (long)(int)uVar2;
  uVar5 = 0;
  uVar8 = 0;
  if (0 < (int)uVar2) {
    uVar8 = (ulong)uVar2;
  }
  uVar6 = (ulong)(uint)r;
  if (r < 1) {
    uVar6 = uVar5;
  }
  for (; uVar5 != uVar6; uVar5 = uVar5 + 1) {
    for (uVar7 = 0;
        lVar1 = *(long *)&(ivolt->
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar5].
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data, uVar8 != uVar7; uVar7 = uVar7 + 1) {
      poVar3 = (ostream *)std::ostream::operator<<(fs,*(float *)(lVar1 + uVar7 * 4));
      std::operator<<(poVar3,"\t");
    }
    poVar3 = (ostream *)std::ostream::operator<<(fs,*(float *)(lVar1 + lVar4 * 4));
    std::operator<<(poVar3,"\n");
  }
  std::operator<<(fs,anon_var_dwarf_11c49d);
  for (uVar5 = 0; uVar5 != uVar6; uVar5 = uVar5 + 1) {
    for (uVar7 = 0;
        lVar1 = *(long *)&(fvolt->
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar5].
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data, uVar8 != uVar7; uVar7 = uVar7 + 1) {
      poVar3 = (ostream *)std::ostream::operator<<(fs,*(float *)(lVar1 + uVar7 * 4));
      std::operator<<(poVar3,"\t");
    }
    poVar3 = (ostream *)std::ostream::operator<<(fs,*(float *)(lVar1 + lVar4 * 4));
    std::operator<<(poVar3,"\n");
  }
  std::operator<<(fs,
                  "The potential drops on each resistance are saved in the potential drop matrix..\n"
                 );
  for (uVar5 = 0; uVar5 != uVar6; uVar5 = uVar5 + 1) {
    for (uVar7 = 0;
        lVar1 = *(long *)&(fall->
                          super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                          )._M_impl.super__Vector_impl_data._M_start[uVar5].
                          super__Vector_base<float,_std::allocator<float>_>._M_impl.
                          super__Vector_impl_data, uVar8 != uVar7; uVar7 = uVar7 + 1) {
      poVar3 = (ostream *)std::ostream::operator<<(fs,*(float *)(lVar1 + uVar7 * 4));
      std::operator<<(poVar3,"\t");
    }
    poVar3 = (ostream *)std::ostream::operator<<(fs,*(float *)(lVar1 + lVar4 * 4));
    std::operator<<(poVar3,"\n");
  }
  if (((byte)fs[*(long *)(*(long *)fs + -0x18) + 0x20] & 5) == 0) {
    puts("\nThe voltage.dat file was written correctly!");
    return;
  }
  std::operator<<((ostream *)&std::cout,
                  "\nThere was an error in writing the file \'voltage.dat\'!\n");
  return;
}

Assistant:

inline void
saveVoltageTo(
        std::ostream &fs,
        int r,
        const vector<vector<float>> &ivolt,
        const vector<vector<float>> &fvolt,
        const vector<vector<float>> &fall
)
{
    fs.setf(std::ios::fixed);
    int i,j;

    /*Scrivo su file*/
    fs << "The values ​​obtained for the voltages respect the physical laws\n";
    for(i=0; i<=r-1; i++){
        for(j=0; j<r-1; j++) {
            fs << ivolt[i][j] << "\t";
        }
        fs << ivolt[i][r-1] << "\n";
    }
    fs << "The values ​​of the voltages at the end of the branch are saved in the final voltage matrix.\n";

    for(i=0; i<=r-1; i++){
        for(j=0; j<r-1; j++) {
            fs << fvolt[i][j] << "\t";
        }
        fs << fvolt[i][r-1] << "\n";
    }
    fs << "The potential drops on each resistance are saved in the potential drop matrix..\n";
    for(i=0; i<=r-1; i++){
        for(j=0; j<r-1; j++) {
            fs << fall[i][j] << "\t";
        }
        fs << fall[i][r-1] << "\n";
    }

    if (!fs)
        std::cout << "\nThere was an error in writing the file 'voltage.dat'!\n";
    else
        printf("\nThe voltage.dat file was written correctly!\n");
}